

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

void __thiscall dxil_spv::SPIRVModule::Impl::build_discard_call_exit(Impl *this)

{
  Builder *this_00;
  Block *pBVar1;
  Id IVar2;
  Function *pFVar3;
  Block *this_01;
  Block *this_02;
  _Head_base<0UL,_spv::Instruction_*,_false> local_70;
  _Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_68;
  Block *entry;
  vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
  local_48;
  
  this_00 = &this->builder;
  pBVar1 = (this->builder).buildPoint;
  pFVar3 = this->discard_function;
  if (pFVar3 == (Function *)0x0) {
    entry = (Block *)0x0;
    IVar2 = spv::Builder::makeVoidType(this_00);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pFVar3 = spv::Builder::makeFunctionEntry
                       (this_00,DecorationMax,IVar2,"discard_exit",(Vector<Id> *)&local_68,&local_48
                        ,&entry);
    this->discard_function = pFVar3;
    std::
    vector<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>,_dxil_spv::ThreadLocalAllocator<std::vector<spv::Decoration,_dxil_spv::ThreadLocalAllocator<spv::Decoration>_>_>_>
    ::~vector(&local_48);
    std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
              (&local_68);
    this_01 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_01,IVar2,this->discard_function);
    this_02 = (Block *)allocate_in_thread(0x78);
    IVar2 = (this->builder).uniqueId + 1;
    (this->builder).uniqueId = IVar2;
    spv::Block::Block(this_02,IVar2,this->discard_function);
    (this->builder).buildPoint = entry;
    IVar2 = spv::Builder::createLoad(this_00,this->discard_state_var_id);
    spv::Builder::createSelectionMerge(this_00,this_02,0);
    spv::Builder::createConditionalBranch(this_00,IVar2,this_01,this_02);
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_68._M_impl.super__Vector_impl_data._M_start._4_4_,0xfc);
    std::make_unique<spv::Instruction,spv::Op>((Op *)&local_70);
    add_instruction(this,this_01,
                    (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                    &local_70);
    if (local_70._M_head_impl != (Instruction *)0x0) {
      (*(local_70._M_head_impl)->_vptr_Instruction[1])();
    }
    local_70._M_head_impl = (Instruction *)0x0;
    (this->builder).buildPoint = this_02;
    spv::Builder::makeReturn(this_00,false,0);
    pFVar3 = this->discard_function;
  }
  (this->builder).buildPoint = pBVar1;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spv::Builder::createFunctionCall(this_00,pFVar3,(Vector<spv::Id> *)&local_68);
  std::_Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~_Vector_base
            (&local_68);
  return;
}

Assistant:

void SPIRVModule::Impl::build_discard_call_exit()
{
	auto *current_build_point = builder.getBuildPoint();

	if (!discard_function)
	{
		spv::Block *entry = nullptr;
		discard_function =
		    builder.makeFunctionEntry(spv::NoPrecision, builder.makeVoidType(), "discard_exit", {}, {}, &entry);

		auto *true_block = new spv::Block(builder.getUniqueId(), *discard_function);
		auto *false_block = new spv::Block(builder.getUniqueId(), *discard_function);

		builder.setBuildPoint(entry);
		spv::Id loaded_state = builder.createLoad(discard_state_var_id);
		builder.createSelectionMerge(false_block, 0);
		builder.createConditionalBranch(loaded_state, true_block, false_block);
		add_instruction(true_block, std::make_unique<spv::Instruction>(spv::OpKill));
		builder.setBuildPoint(false_block);
		builder.makeReturn(false);
	}

	builder.setBuildPoint(current_build_point);
	builder.createFunctionCall(discard_function, {});
}